

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::setupFixed
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool param_8)

{
  btVector3 *pbVar1;
  btQuaternion *pbVar2;
  btMultibodyLink *pbVar3;
  undefined8 uVar4;
  
  pbVar3 = (this->m_links).m_data;
  pbVar3[i].m_mass = mass;
  uVar4 = *(undefined8 *)(inertia->m_floats + 2);
  pbVar1 = &pbVar3[i].m_inertiaLocal;
  *(undefined8 *)pbVar1->m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
  pbVar3 = (this->m_links).m_data;
  pbVar3[i].m_parent = parent;
  uVar4 = *(undefined8 *)((rotParentToThis->super_btQuadWord).m_floats + 2);
  pbVar2 = &pbVar3[i].m_zeroRotParentToThis;
  *(undefined8 *)(pbVar2->super_btQuadWord).m_floats =
       *(undefined8 *)(rotParentToThis->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar2->super_btQuadWord).m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)(thisPivotToThisComOffset->m_floats + 2);
  pbVar1 = &(this->m_links).m_data[i].m_dVector;
  *(undefined8 *)pbVar1->m_floats = *(undefined8 *)thisPivotToThisComOffset->m_floats;
  *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)(parentComToThisPivotOffset->m_floats + 2);
  pbVar1 = &(this->m_links).m_data[i].m_eVector;
  *(undefined8 *)pbVar1->m_floats = *(undefined8 *)parentComToThisPivotOffset->m_floats;
  *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
  pbVar3 = (this->m_links).m_data;
  pbVar3[i].m_jointType = eFixed;
  pbVar3[i].m_dofCount = 0;
  pbVar3[i].m_posVarCount = 0;
  *(byte *)&pbVar3[i].m_flags = (byte)pbVar3[i].m_flags | 1;
  btMultibodyLink::updateCacheMultiDof(pbVar3 + i,(btScalar *)0x0);
  updateLinksDofOffsets(this);
  return;
}

Assistant:

void btMultiBody::setupFixed(int i,
						   btScalar mass,
						   const btVector3 &inertia,
						   int parent,
						   const btQuaternion &rotParentToThis,
						   const btVector3 &parentComToThisPivotOffset,
                           const btVector3 &thisPivotToThisComOffset, bool /*deprecatedDisableParentCollision*/)
{
	
	m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;
	m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;    

	m_links[i].m_jointType = btMultibodyLink::eFixed;
	m_links[i].m_dofCount = 0;
	m_links[i].m_posVarCount = 0;

	m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;    
	
	m_links[i].updateCacheMultiDof();

	updateLinksDofOffsets();

}